

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O2

int equal_email(uchar *a,size_t a_len,uchar *b,size_t b_len,uint unused_flags)

{
  uchar *puVar1;
  uchar *puVar2;
  ulong uVar3;
  int iVar4;
  uchar *puVar5;
  uchar *puVar6;
  ulong uVar7;
  
  if (a_len == b_len) {
    puVar1 = a + -1;
    puVar2 = b + -1;
    uVar3 = 0;
    do {
      uVar7 = uVar3;
      puVar6 = puVar2;
      puVar5 = puVar1;
      if (a_len == uVar7) goto LAB_002059e4;
      if (puVar5[a_len] == '@') break;
      puVar1 = puVar5 + -1;
      puVar2 = puVar6 + -1;
      uVar3 = uVar7 + 1;
    } while (puVar6[a_len] != '@');
    iVar4 = equal_nocase(puVar5 + a_len,uVar7 + 1,puVar6 + a_len,uVar7 + 1,unused_flags);
    if (iVar4 != 0) {
      if (a_len - 1 != uVar7) {
        a_len = a_len + ~uVar7;
      }
LAB_002059e4:
      iVar4 = equal_case(a,a_len,b,a_len,unused_flags);
      return iVar4;
    }
  }
  return 0;
}

Assistant:

static int equal_email(const unsigned char *a, size_t a_len,
                       const unsigned char *b, size_t b_len,
                       unsigned int unused_flags) {
  size_t i = a_len;
  if (a_len != b_len) {
    return 0;
  }
  // We search backwards for the '@' character, so that we do not have to
  // deal with quoted local-parts.  The domain part is compared in a
  // case-insensitive manner.
  while (i > 0) {
    --i;
    if (a[i] == '@' || b[i] == '@') {
      if (!equal_nocase(a + i, a_len - i, b + i, a_len - i, 0)) {
        return 0;
      }
      break;
    }
  }
  if (i == 0) {
    i = a_len;
  }
  return equal_case(a, i, b, i, 0);
}